

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void notch::core::Init::uniformNguyenWidrow
               (unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                *rng,Array *weights,int nIn,int nOut)

{
  anon_class_24_4_29c96334 __gen;
  anon_class_24_3_0fc55a51 __gen_00;
  size_t sVar1;
  float *pfVar2;
  float *pfVar3;
  double dVar4;
  double dVar5;
  undefined4 uStack_54;
  float w_row_norm;
  float beta;
  float overlap;
  uniform_real_distribution<float> U;
  int nOut_local;
  int nIn_local;
  Array *weights_local;
  unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  *rng_local;
  
  U._M_param._M_a = (float)nOut;
  U._M_param._M_b = (float)nIn;
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)&beta,-1.0,1.0);
  dVar4 = pow((double)(int)U._M_param._M_a,(double)(1.0 / (float)(int)U._M_param._M_b));
  sVar1 = std::valarray<float>::size(weights);
  if (sVar1 == (long)((int)U._M_param._M_b * (int)U._M_param._M_a)) {
    dVar5 = sqrt((double)(int)U._M_param._M_b / 3.0);
    pfVar2 = std::begin<float>(weights);
    pfVar3 = std::end<float>(weights);
    __gen.w_row_norm = (float)dVar5;
    __gen.beta = (float)(dVar4 * 0.699999988079071);
    __gen.rng = rng;
    __gen.U = (uniform_real_distribution<float> *)&beta;
    ::std::
    generate<float*,notch::core::Init::uniformNguyenWidrow(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int)::_lambda()_1_>
              (pfVar2,pfVar3,__gen);
  }
  else {
    pfVar2 = std::begin<float>(weights);
    pfVar3 = std::end<float>(weights);
    __gen_00._20_4_ = uStack_54;
    __gen_00.beta = (float)(dVar4 * 0.699999988079071);
    __gen_00.rng = rng;
    __gen_00.U = (uniform_real_distribution<float> *)&beta;
    ::std::
    generate<float*,notch::core::Init::uniformNguyenWidrow(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int)::_lambda()_2_>
              (pfVar2,pfVar3,__gen_00);
  }
  return;
}

Assistant:

static
    void uniformNguyenWidrow(std::unique_ptr<RNG> &rng,
                             Array &weights, int nIn, int nOut) {
        std::uniform_real_distribution<float> U(-1, +1);
        float overlap = 0.7f; // "to have the intervals overlap slightly"
        float beta = overlap * pow(nOut, 1.0f / nIn); // target row norm
        if (weights.size() == static_cast<size_t>(nIn*nOut)) {
            // we're initializing weights
            float w_row_norm = sqrt(nIn / 3.0); // for nIn elems in U([-1,1])
            std::generate(std::begin(weights), std::end(weights),
                    [&U, &rng, beta, w_row_norm] {
                        // w_{ji} in U([-1,1])
                        float w_ji = U(*rng.get());
                        // to have row norm equal beta
                        return w_ji * beta / w_row_norm;
                    });
        } else { // we're initializing bias
            // b_i = uniform random number in [-beta, beta]
            std::generate(std::begin(weights), std::end(weights),
                    [&U, &rng, beta] {
                        float u = U(*rng.get());
                        return u * beta;
                    });
         }
    }